

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-array.h
# Opt level: O3

int read_array(coda_cursor_conflict *cursor,void *dst)

{
  ushort *puVar1;
  ulong uVar2;
  coda_type_class cVar3;
  undefined4 uVar4;
  coda_dynamic_type_struct *pcVar5;
  long byte_offset;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  int iVar26;
  coda_dynamic_type_struct *pcVar27;
  long lVar28;
  void *dst_00;
  size_t __n;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pcVar5 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar5[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0xd7,"int read_array(const coda_cursor *, void *)");
  }
  pcVar27 = *(coda_dynamic_type_struct **)(pcVar5 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar5 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar27 = pcVar5;
  }
  cVar3 = pcVar27->definition->type_class;
  iVar26 = *(int *)&pcVar5[2].definition;
  if (0 < iVar26) {
    __n = (size_t)(int)(pcVar5[3].backend * *(int *)((long)&pcVar5[2].definition + 4));
    lVar28 = 0;
    dst_00 = dst;
    do {
      byte_offset = *(long *)(*(long *)(pcVar5 + 4) + lVar28 * 8);
      if (byte_offset < 0) {
        coda_set_error(-200,"Missing record not supported for CDF variable");
        return -1;
      }
      if (pcVar5[4].definition == (coda_type *)0x0) {
        iVar26 = read_bytes((coda_product *)cursor->product[1].filename,byte_offset,__n,dst_00);
        if (iVar26 != 0) {
          return -1;
        }
      }
      else {
        memcpy(dst_00,(void *)((long)&(pcVar5[4].definition)->format + byte_offset),__n);
      }
      lVar28 = lVar28 + 1;
      iVar26 = *(int *)&pcVar5[2].definition;
      dst_00 = (void *)((long)dst_00 + __n);
    } while (lVar28 < iVar26);
  }
  if ((cVar3 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
    switch(pcVar5[3].backend) {
    case coda_backend_binary:
      break;
    case 2:
      if (0 < iVar26 * *(int *)((long)&pcVar5[2].definition + 4)) {
        lVar28 = 0;
        do {
          puVar1 = (ushort *)((long)dst + lVar28 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar28 = lVar28 + 1;
        } while (lVar28 < (long)*(int *)((long)&pcVar5[2].definition + 4) *
                          (long)*(int *)&pcVar5[2].definition);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                    ,0x116,"int read_array(const coda_cursor *, void *)");
    case 4:
      if (0 < iVar26 * *(int *)((long)&pcVar5[2].definition + 4)) {
        lVar28 = 0;
        do {
          uVar4 = *(undefined4 *)((long)dst + lVar28 * 4);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)
                                                  ((uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                               CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4)) >>
                                     0x10),(short)uVar4) & 0xffff00ff00ff00ff;
          auVar30 = pshuflw(auVar29,auVar29,0x1b);
          sVar6 = auVar30._0_2_;
          sVar7 = auVar30._2_2_;
          sVar8 = auVar30._4_2_;
          sVar9 = auVar30._6_2_;
          *(uint *)((long)dst + lVar28 * 4) =
               CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                                 CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] -
                                          (0xff < sVar7),
                                          (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] -
                                          (0xff < sVar6))));
          lVar28 = lVar28 + 1;
        } while (lVar28 < (long)*(int *)((long)&pcVar5[2].definition + 4) *
                          (long)*(int *)&pcVar5[2].definition);
      }
      break;
    case 8:
      if (0 < iVar26 * *(int *)((long)&pcVar5[2].definition + 4)) {
        lVar28 = 0;
        do {
          uVar2 = *(ulong *)((long)dst + lVar28 * 8);
          auVar14._8_6_ = 0;
          auVar14._0_8_ = uVar2;
          auVar14[0xe] = (char)(uVar2 >> 0x38);
          auVar15._8_4_ = 0;
          auVar15._0_8_ = uVar2;
          auVar15[0xc] = (char)(uVar2 >> 0x30);
          auVar15._13_2_ = auVar14._13_2_;
          auVar16._8_4_ = 0;
          auVar16._0_8_ = uVar2;
          auVar16._12_3_ = auVar15._12_3_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar2;
          auVar17[10] = (char)(uVar2 >> 0x28);
          auVar17._11_4_ = auVar16._11_4_;
          auVar18._8_2_ = 0;
          auVar18._0_8_ = uVar2;
          auVar18._10_5_ = auVar17._10_5_;
          auVar19[8] = (char)(uVar2 >> 0x20);
          auVar19._0_8_ = uVar2;
          auVar19._9_6_ = auVar18._9_6_;
          auVar30[7] = 0;
          auVar30._0_7_ = auVar19._8_7_;
          auVar22._7_8_ = 0;
          auVar22._0_7_ = auVar19._8_7_;
          auVar24._1_8_ = SUB158(auVar22 << 0x40,7);
          auVar24[0] = (char)(uVar2 >> 0x18);
          auVar24._9_6_ = 0;
          auVar23._1_10_ = SUB1510(auVar24 << 0x30,5);
          auVar23[0] = (char)(uVar2 >> 0x10);
          auVar25._11_4_ = 0;
          auVar25._0_11_ = auVar23;
          auVar20[2] = (char)(uVar2 >> 8);
          auVar20._0_2_ = (ushort)uVar2;
          auVar20._3_12_ = SUB1512(auVar25 << 0x20,3);
          auVar21._2_13_ = auVar20._2_13_;
          auVar21._0_2_ = (ushort)uVar2 & 0xff;
          auVar30._8_4_ = auVar21._0_4_;
          auVar30._12_4_ = auVar23._0_4_;
          auVar30 = pshuflw(auVar30,auVar30,0x1b);
          auVar30 = pshufhw(auVar30,auVar30,0x1b);
          sVar6 = auVar30._0_2_;
          sVar7 = auVar30._2_2_;
          sVar8 = auVar30._4_2_;
          sVar9 = auVar30._6_2_;
          sVar10 = auVar30._8_2_;
          sVar11 = auVar30._10_2_;
          sVar12 = auVar30._12_2_;
          sVar13 = auVar30._14_2_;
          *(ulong *)((long)dst + lVar28 * 8) =
               CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13),
                        CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12),
                                 CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar30[10] -
                                          (0xff < sVar11),
                                          CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar30[8] -
                                                   (0xff < sVar10),
                                                   CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                            auVar30[6] - (0xff < sVar9),
                                                            CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                     auVar30[4] - (0xff < sVar8),
                                                                     CONCAT11((0 < sVar7) *
                                                                              (sVar7 < 0x100) *
                                                                              auVar30[2] -
                                                                              (0xff < sVar7),
                                                                              (0 < sVar6) *
                                                                              (sVar6 < 0x100) *
                                                                              auVar30[0] -
                                                                              (0xff < sVar6))))))));
          lVar28 = lVar28 + 1;
        } while (lVar28 < (long)*(int *)((long)&pcVar5[2].definition + 4) *
                          (long)*(int *)&pcVar5[2].definition);
      }
    }
  }
  return 0;
}

Assistant:

static int read_array(const coda_cursor *cursor, read_function read_basic_type_function, uint8_t *dst,
                      int basic_type_size, coda_array_ordering array_ordering)
{
    coda_cursor array_cursor;
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    int i;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    array_cursor = *cursor;
    if (num_dims <= 1 || array_ordering != coda_array_ordering_fortran)
    {
        /* C-style array ordering */

        num_elements = 1;
        for (i = 0; i < num_dims; i++)
        {
            num_elements *= dim[i];
        }

        if (num_elements > 0)
        {
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (i = 0; i < num_elements; i++)
            {
                if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
                {
                    return -1;
                }
                if (i < num_elements - 1)
                {
                    if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                    {
                        return -1;
                    }
                }
            }
        }
    }
    else
    {
        long incr[CODA_MAX_NUM_DIMS + 1];
        long increment;
        long c_index;
        long fortran_index;

        /* Fortran-style array ordering */

        incr[0] = 1;
        for (i = 0; i < num_dims; i++)
        {
            incr[i + 1] = incr[i] * dim[i];
        }

        increment = incr[num_dims - 1];
        num_elements = incr[num_dims];

        if (num_elements > 0)
        {
            c_index = 0;
            fortran_index = 0;
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (;;)
            {
                do
                {
                    if ((*read_basic_type_function)(&array_cursor, &dst[fortran_index * basic_type_size]) != 0)
                    {
                        return -1;
                    }
                    c_index++;
                    if (c_index < num_elements)
                    {
                        if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                        {
                            return -1;
                        }
                    }
                    fortran_index += increment;
                } while (fortran_index < num_elements);

                if (c_index == num_elements)
                {
                    break;
                }

                fortran_index += incr[num_dims - 2] - incr[num_dims];
                i = num_dims - 3;
                while (i >= 0 && fortran_index >= incr[i + 2])
                {
                    fortran_index += incr[i] - incr[i + 2];
                    i--;
                }
            }
        }
    }

    return 0;
}